

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O0

void __thiscall
suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>::
construct_arr<2ul>(suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
                   *this,bool fast_resolval)

{
  ulong uVar1;
  value_type vVar2;
  int iVar3;
  MPI_Comm poVar4;
  size_type sVar5;
  size_type sVar6;
  value_type_conflict vVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  ostream *poVar11;
  void *this_00;
  pair<unsigned_long,_unsigned_long> pVar12;
  allocator local_371;
  string local_370 [32];
  ulong local_350;
  size_t i_2;
  string local_340 [39];
  allocator local_319;
  string local_318 [39];
  allocator local_2f1;
  string local_2f0 [39];
  allocator local_2c9;
  string local_2c8 [32];
  undefined1 local_2a8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> cpy_SA_1;
  string local_288 [32];
  undefined1 local_268 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> cpy_SA;
  string local_248 [32];
  ulong local_228;
  size_t i_1;
  string local_218 [32];
  tuple<unsigned_long&,unsigned_long&> local_1f8 [16];
  pair<unsigned_long,_unsigned_long> local_1e8;
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [32];
  ulong local_160;
  size_t i;
  size_t offset;
  undefined1 local_148 [8];
  vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_> tuples;
  section_timer looptimer;
  size_t shift_by;
  size_t unfinished_elements;
  size_t unfinished_buckets;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_B_SA;
  string local_b0 [32];
  tuple<unsigned_int&,unsigned_int&> local_90 [32];
  pair<unsigned_int,_unsigned_int> local_70;
  uint local_64;
  uint bits_per_char;
  uint k;
  section_timer timer;
  bool fast_resolval_local;
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
  *this_local;
  
  timer.start.__d.__r._7_1_ = fast_resolval;
  poVar4 = mxx::comm::operator_cast_to_ompi_communicator_t_((comm *)(this + 0x18));
  mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::
  section_timer_impl((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)
                     &bits_per_char,(ostream *)&std::cerr,poVar4,0);
  local_70 = suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
             ::initial_bucketing((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                                  *)this,0);
  std::tie<unsigned_int,unsigned_int>((uint *)local_90,&local_64);
  std::tuple<unsigned_int&,unsigned_int&>::operator=(local_90,&local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b0,"initial-bucketing",
             (allocator *)
             ((long)&local_B_SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
            ((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)
             &bits_per_char,(string *)local_b0);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&local_B_SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x90));
  sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0xa8));
  if (sVar5 != sVar6) {
    sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0xa8));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x90),sVar5);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&unfinished_buckets);
  unfinished_elements = (size_t)(1 << ((byte)local_64 & 0x1f));
  uVar1 = *(ulong *)(this + 8);
  looptimer.start.__d.__r._4_4_ = 0;
  looptimer.start.__d.__r._0_4_ = local_64;
  for (; (ulong)looptimer.start.__d.__r < (ulong)*(rep_conflict *)(this + 8);
      looptimer.start.__d.__r = (duration)((long)looptimer.start.__d.__r << 1)) {
    poVar4 = mxx::comm::operator_cast_to_ompi_communicator_t_((comm *)(this + 0x18));
    mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::
    section_timer_impl((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *
                       )&tuples.
                         super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(ostream *)&std::cerr,
                       poVar4,0);
    sVar5 = *(size_type *)(this + 0x10);
    std::allocator<std::array<unsigned_long,_3UL>_>::allocator
              ((allocator<std::array<unsigned_long,_3UL>_> *)((long)&offset + 7));
    std::vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>::
    vector((vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
            *)local_148,sVar5,(allocator<std::array<unsigned_long,_3UL>_> *)((long)&offset + 7));
    std::allocator<std::array<unsigned_long,_3UL>_>::~allocator
              ((allocator<std::array<unsigned_long,_3UL>_> *)((long)&offset + 7));
    i = mxx::partition::block_decomposition_buffered<unsigned_long>::excl_prefix_size
                  ((block_decomposition_buffered<unsigned_long> *)(this + 0x50));
    for (local_160 = 0; local_160 < *(ulong *)(this + 0x10); local_160 = local_160 + 1) {
      vVar7 = local_160 + i;
      pvVar8 = std::
               vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
               ::operator[]((vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                             *)local_148,local_160);
      pvVar9 = std::array<unsigned_long,_3UL>::operator[](pvVar8,0);
      *pvVar9 = vVar7;
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0xa8),
                           local_160);
      vVar2 = *pvVar10;
      pvVar8 = std::
               vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
               ::operator[]((vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                             *)local_148,local_160);
      pvVar9 = std::array<unsigned_long,_3UL>::operator[](pvVar8,1);
      *pvVar9 = vVar2;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_180,"arr-tupelize",&local_181);
    mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
              ((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)
               &tuples.
                super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_180);
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
    ::shift_buckets<2UL>
              ((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                *)this,(size_t)looptimer.start.__d.__r,
               (vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                *)local_148);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a8,"shift-buckets",&local_1a9);
    mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
              ((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)
               &tuples.
                super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_1a8);
    std::__cxx11::string::~string(local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
    ::sort_array_tuples<2UL>
              ((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                *)this,(vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                        *)local_148);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d0,"ISA-to-SA",&local_1d1);
    mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
              ((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)
               &tuples.
                super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_1d0);
    std::__cxx11::string::~string(local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    pVar12 = suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
             ::rebucket_arr<2UL>((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                                  *)this,(vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                                          *)local_148,true);
    local_1e8 = pVar12;
    std::tie<unsigned_long,unsigned_long>((unsigned_long *)local_1f8,&unfinished_elements);
    std::tuple<unsigned_long&,unsigned_long&>::operator=(local_1f8,&local_1e8);
    iVar3 = mxx::comm::rank((comm *)(this + 0x18));
    if (iVar3 == 0) {
      poVar11 = std::operator<<((ostream *)&std::cerr,"iteration ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,(ulong)looptimer.start.__d.__r);
      poVar11 = std::operator<<(poVar11,": unfinished buckets = ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,unfinished_elements);
      poVar11 = std::operator<<(poVar11,", unfinished elements = ");
      this_00 = (void *)std::ostream::operator<<(poVar11,uVar1);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_218,"rebucket",(allocator *)((long)&i_1 + 7));
    mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
              ((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)
               &tuples.
                super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_218);
    std::__cxx11::string::~string(local_218);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 7));
    for (local_228 = 0; local_228 < *(ulong *)(this + 0x10); local_228 = local_228 + 1) {
      pvVar8 = std::
               vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
               ::operator[]((vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                             *)local_148,local_228);
      pvVar9 = std::array<unsigned_long,_3UL>::operator[](pvVar8,0);
      vVar7 = *pvVar9;
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x90),
                           local_228);
      *pvVar10 = vVar7;
    }
    std::vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>::
    clear((vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
           *)local_148);
    std::vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>::
    shrink_to_fit((vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                   *)local_148);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_248,"arr-untupelize",
               (allocator *)
               ((long)&cpy_SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
              ((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)
               &tuples.
                super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_248);
    std::__cxx11::string::~string(local_248);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&cpy_SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    if (((timer.start.__d.__r._7_1_ & 1) == 0) || (*(ulong *)(this + 8) / 10 <= uVar1)) {
      if (((ulong)((long)looptimer.start.__d.__r << 1) < *(ulong *)(this + 8)) &&
         (unfinished_elements != 0)) {
        suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
        ::reorder_sa_to_isa((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                             *)this);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2f0,"SA-to-ISA",&local_2f1);
        mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
                  ((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)
                   &tuples.
                    super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_2f0);
        std::__cxx11::string::~string(local_2f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
      }
      else {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2a8,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x90));
        suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
        ::reorder_sa_to_isa((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                             *)this,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    local_2a8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2c8,"SA-to-ISA",&local_2c9);
        mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
                  ((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)
                   &tuples.
                    super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_2c8);
        std::__cxx11::string::~string(local_2c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2a8);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_318,"sac-iteration",&local_319);
      mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
                ((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)
                 &bits_per_char,(string *)local_318);
      std::__cxx11::string::~string(local_318);
      std::allocator<char>::~allocator((allocator<char> *)&local_319);
      if (unfinished_elements == 0) {
        cpy_SA_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 2;
      }
      else {
        cpy_SA_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      }
    }
    else {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_268,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x90));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&unfinished_buckets,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0xa8));
      suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
      ::reorder_sa_to_isa((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                           *)this,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_268
                         );
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_288,"SA-to-ISA",
                 (allocator *)
                 ((long)&cpy_SA_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
                ((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)
                 &tuples.
                  super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_288);
      std::__cxx11::string::~string(local_288);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&cpy_SA_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      cpy_SA_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 2;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_268);
    }
    std::vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>::
    ~vector((vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
             *)local_148);
    mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::
    ~section_timer_impl((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>
                         *)&tuples.
                            super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((int)cpy_SA_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage != 0) break;
  }
  if (unfinished_elements != 0) {
    iVar3 = mxx::comm::rank((comm *)(this + 0x18));
    if (iVar3 == 0) {
      poVar11 = std::operator<<((ostream *)&std::cerr,"Starting Bucket chasing algorithm");
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    }
    suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
    ::construct_msgs((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                      *)this,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &unfinished_buckets,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0xa8),
                     (uint)looptimer.start.__d.__r * 2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_340,"construct-msgs",(allocator *)((long)&i_2 + 7));
  mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
            ((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)
             &bits_per_char,(string *)local_340);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i_2 + 7));
  local_350 = 0;
  while( true ) {
    uVar1 = local_350;
    sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0xa8));
    if (sVar5 <= uVar1) break;
    pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0xa8),
                         local_350);
    *pvVar10 = *pvVar10 - 1;
    local_350 = local_350 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_370,"fix-isa",&local_371);
  mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
            ((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)
             &bits_per_char,(string *)local_370);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&unfinished_buckets);
  mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::
  ~section_timer_impl((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)
                      &bits_per_char);
  return;
}

Assistant:

void construct_arr(bool fast_resolval = true) {
    SAC_TIMER_START();

    /***********************
     *  Initial bucketing  *
     ***********************/

    // create initial k-mers and use these as the initial bucket numbers
    // for each character position
    // `k` depends on the alphabet size and the word size of each suffix array
    // element. `k` is choosen to maximize the number of alphabet characters
    // that fit into one machine word
    unsigned int k;
    unsigned int bits_per_char;
    std::tie(k, bits_per_char) = initial_bucketing();
    SAC_TIMER_END_SECTION("initial-bucketing");

    // init local_SA
    if (local_SA.size() != local_B.size()) {
        local_SA.resize(local_B.size());
    }

    std::vector<index_t> local_B_SA;
    std::size_t unfinished_buckets = 1<<k;
    std::size_t unfinished_elements = n;
    std::size_t shift_by;

    /*******************************
     *  Prefix Doubling main loop  *
     *******************************/
    for (shift_by = k; shift_by < n; shift_by*=L) {
        SAC_TIMER_LOOP_START();

        /*****************
         *  fill tuples  *
         *****************/
        std::vector<std::array<index_t, L+1> > tuples(local_size);
        std::size_t offset = part.excl_prefix_size();
        for (std::size_t i = 0; i < local_size; ++i) {
            tuples[i][0] = i + offset;
            tuples[i][1] = local_B[i];
        }
        SAC_TIMER_END_LOOP_SECTION(shift_by, "arr-tupelize");

        /**************************************************
         *  Pairing buckets by shifting `shift_by` = 2^k  *
         **************************************************/
        // shift the B1 buckets by 2^k to the left => equals B2
        shift_buckets<L>(shift_by, tuples);
        SAC_TIMER_END_LOOP_SECTION(shift_by, "shift-buckets");


        /*************
         *  ISA->SA  *
         *************/
        // by using sample sort on tuples (B1,B2)
        sort_array_tuples<L>(tuples);
        SAC_TIMER_END_LOOP_SECTION(shift_by, "ISA-to-SA");


        /****************
         *  Update LCP  *
         ****************/
        // if this is the first iteration: create LCP, otherwise update
        // TODO: LCP construciton is not (yet) implemented for std::array based construction
        /*
        if (_CONSTRUCT_LCP)
        {
            if (shift_by == k) {
                initial_kmer_lcp(k, bits_per_char, local_B2);
                SAC_TIMER_END_LOOP_SECTION(shift_by, "init-lcp");
            } else {
                resolve_next_lcp(shift_by, local_B2);
                SAC_TIMER_END_LOOP_SECTION(shift_by, "update-lcp");
            }
        }
        */

        /*******************************
         *  Assign new bucket numbers  *
         *******************************/
        std::tie(unfinished_buckets,unfinished_elements) = rebucket_arr<L>(tuples, true);
        if (comm.rank() == 0) {
            INFO("iteration " << shift_by << ": unfinished buckets = " << unfinished_buckets << ", unfinished elements = " << unfinished_elements);
        }
        SAC_TIMER_END_LOOP_SECTION(shift_by, "rebucket");


        /**************************************
         *  Reset local_SA array from tuples  *
         **************************************/
        for (std::size_t i = 0; i < local_size; ++i) {
            local_SA[i] = tuples[i][0];
        }

        // deallocate all memory
        tuples.clear();
        tuples.shrink_to_fit();
        SAC_TIMER_END_LOOP_SECTION(shift_by, "arr-untupelize");


        /*************
         *  SA->ISA  *
         *************/
        // by bucketing to correct target processor using the `SA` array

        if (fast_resolval && unfinished_elements < n/10) {
            // prepare for bucket chaising (needs SA, and bucket arrays in both
            // SA and ISA order)
            std::vector<index_t> cpy_SA(local_SA);
            local_B_SA = local_B; // copy
            reorder_sa_to_isa(cpy_SA);
            SAC_TIMER_END_LOOP_SECTION(shift_by, "SA-to-ISA");
            break;
        } else if ((shift_by * L) >= n || unfinished_buckets == 0) {
            // if last iteration, use copy of local_SA for reorder and keep
            // original SA
            std::vector<index_t> cpy_SA(local_SA);
            reorder_sa_to_isa(cpy_SA);
            SAC_TIMER_END_LOOP_SECTION(shift_by, "SA-to-ISA");
        } else {
            reorder_sa_to_isa();
            SAC_TIMER_END_LOOP_SECTION(shift_by, "SA-to-ISA");
        }

        // end iteratior
        SAC_TIMER_END_SECTION("sac-iteration");

        // check for termination condition
        if (unfinished_buckets == 0)
            break;
    }

    if (unfinished_buckets > 0) {
        if (comm.rank() == 0)
            INFO("Starting Bucket chasing algorithm");
        construct_msgs(local_B_SA, local_B, L*shift_by);
    }
    SAC_TIMER_END_SECTION("construct-msgs");

    // now local_SA is actual block decomposed SA and local_B is actual ISA with an offset of one
    for (std::size_t i = 0; i < local_B.size(); ++i) {
        // the buffer indeces are `1` based indeces, but the ISA should be
        // `0` based indeces
        local_B[i] -= 1;
    }
    SAC_TIMER_END_SECTION("fix-isa");
}